

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O3

void __thiscall ExprTest_CheckIndex_Test::TestBody(ExprTest_CheckIndex_Test *this)

{
  bool bVar1;
  logic_error *plVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  AssertHelper local_60;
  AssertionResult local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [2];
  long local_38 [2];
  
  testing::AssertionSuccess();
  if (local_58.success_ == true) {
    local_48[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"invalid index","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar2,"invalid index");
      *(undefined ***)plVar2 = &PTR__logic_error_001a4a98;
      __cxa_throw(plVar2,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
    }
    testing::AssertionResult::operator<<
              (&local_58,
               (char (*) [118])
               "Expected: mp::internal::CheckIndex(-10, 3) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38) {
      operator_delete(local_48[0].ptr_,local_38[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_48);
  if (local_58.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_58.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x80,
             pcVar3);
  testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (((local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_48[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_48[0].ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  testing::AssertionSuccess();
  if (local_58.success_ == true) {
    local_48[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"invalid index","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar2,"invalid index");
      *(undefined ***)plVar2 = &PTR__logic_error_001a4a98;
      __cxa_throw(plVar2,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
    }
    testing::AssertionResult::operator<<
              (&local_58,
               (char (*) [117])
               "Expected: mp::internal::CheckIndex(-1, 3) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38) {
      operator_delete(local_48[0].ptr_,local_38[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_48);
  if (local_58.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_58.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x81,
             pcVar3);
  testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (((local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_48[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_48[0].ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  testing::AssertionSuccess();
  if (local_58.success_ == true) {
    local_48[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"invalid index","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar2,"invalid index");
      *(undefined ***)plVar2 = &PTR__logic_error_001a4a98;
      __cxa_throw(plVar2,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
    }
    testing::AssertionResult::operator<<
              (&local_58,
               (char (*) [116])
               "Expected: mp::internal::CheckIndex(3, 3) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38) {
      operator_delete(local_48[0].ptr_,local_38[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_48);
  if (local_58.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_58.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x82,
             pcVar3);
  testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (((local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_48[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_48[0].ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  testing::AssertionSuccess();
  if (local_58.success_ == true) {
    local_48[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"invalid index","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar2,"invalid index");
      *(undefined ***)plVar2 = &PTR__logic_error_001a4a98;
      __cxa_throw(plVar2,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
    }
    testing::AssertionResult::operator<<
              (&local_58,
               (char (*) [117])
               "Expected: mp::internal::CheckIndex(10, 3) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38) {
      operator_delete(local_48[0].ptr_,local_38[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_48);
  if (local_58.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_58.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x83,
             pcVar3);
  testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (((local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_48[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_48[0].ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST_F(ExprTest, CheckIndex) {
  mp::internal::CheckIndex(0, 3);
  mp::internal::CheckIndex(2, 3);
  EXPECT_ASSERT(mp::internal::CheckIndex(-10, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(-1, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(3, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(10, 3), "invalid index");
}